

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_only.c
# Opt level: O3

int trueEverywhere(int flag)

{
  undefined4 in_EAX;
  int iVar1;
  int tflag;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)CONCAT14(flag != 0,in_EAX);
  iVar1 = GA_Nnodes();
  GA_Igop((int *)((long)&uStack_18 + 4),1,"+");
  return (int)(iVar1 == uStack_18._4_4_);
}

Assistant:

int trueEverywhere(int flag)
{
  int tflag, nprocs;
  if (flag) tflag = 1;
  else tflag = 0;
  nprocs = GA_Nnodes();
  GA_Igop(&tflag,1,"+");
  if (nprocs == tflag) return 1;
  return 0;
}